

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::SocketStream::SocketStream(SocketStream *this,string *targetName)

{
  _func_int *p_Var1;
  int iVar2;
  char *line;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *targetName_local;
  SocketStream *this_local;
  
  local_18 = targetName;
  targetName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tcp",&local_39);
  Stream::Stream((Stream *)&(this->super_DisconnectableStream).field_0x1038,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"tcp",&local_71);
  DisconnectableStream::DisconnectableStream
            (&this->super_DisconnectableStream,&PTR_construction_vtable_24__00152478,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream =
       (_func_int **)&PTR__SocketStream_001523e0;
  *(undefined ***)&(this->super_DisconnectableStream).field_0x1038 = &PTR__SocketStream_00152448;
  ExpandableBuffer::ExpandableBuffer
            ((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020,0x100);
  ParameterSet::add((ParameterSet *)
                    (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                    (long)(this->super_DisconnectableStream).super_SelectableStream.
                          _vptr_SelectableStream[-3]),"tcp:host;port;connectionPort=-1;sock=-1");
  p_Var1 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[-3];
  line = (char *)std::__cxx11::string::c_str();
  ParameterSet::add((ParameterSet *)
                    (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                    (long)p_Var1),line);
  iVar2 = getOrCreateSocket((ParameterSet *)
                            (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                            (long)(this->super_DisconnectableStream).super_SelectableStream.
                                  _vptr_SelectableStream[-3]));
  (this->super_DisconnectableStream).super_SelectableStream.fd = iVar2;
  iVar2 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                     (long)(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream[-3]),"sock");
  if (-1 < iVar2) {
    ParameterSet::erase((ParameterSet *)
                        (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                        (long)(this->super_DisconnectableStream).super_SelectableStream.
                              _vptr_SelectableStream[-3]),"sock");
  }
  return;
}

Assistant:

explicit SocketStream(const string& targetName) :
			Stream("tcp"),
			DisconnectableStream("tcp")
#ifndef TCP_CORK
			,
			sendBuffer(SEND_BUFFER_SIZE_INITIAL)
#endif
		{
			target.add("tcp:host;port;connectionPort=-1;sock=-1");
			target.add(targetName.c_str());

			fd = getOrCreateSocket(target);
			if (target.get<int>("sock") >= 0)
			{
				// remove file descriptor information from target name
				target.erase("sock");
			}

#ifdef TCP_CORK
			// setup TCP Cork for delayed sending
			int flag = 1;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
#endif
		}